

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_166::Applier::visitExpression(Applier *this,Expression *curr)

{
  mapped_type mVar1;
  Module *pMVar2;
  uintptr_t uVar3;
  undefined1 auVar4 [16];
  Index IVar5;
  mapped_type *pmVar6;
  LocalSet *this_00;
  __node_base_ptr p_Var7;
  size_type sVar8;
  Expression *pEVar9;
  __hash_code in_RCX;
  ulong uVar10;
  Type TVar11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  _Hash_node_base *p_Var14;
  _Hash_node_base *p_Var15;
  _Hash_node_base *__k;
  Expression *local_38;
  Expression *curr_local;
  
  TVar11.id = (this->requestInfos).
              super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              ._M_h._M_bucket_count;
  uVar10 = (ulong)curr % TVar11.id;
  p_Var12 = (this->requestInfos).
            super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
            ._M_h._M_buckets[uVar10];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var12 != (__node_base_ptr)0x0) &&
     (p_Var15 = p_Var12->_M_nxt, p_Var13 = p_Var12, (Expression *)p_Var12->_M_nxt[1]._M_nxt != curr)
     ) {
    while (p_Var12 = p_Var15, p_Var15 = p_Var12->_M_nxt, in_RCX = uVar10,
          p_Var15 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)p_Var15[1]._M_nxt % TVar11.id != uVar10) ||
         (p_Var13 = p_Var12, (Expression *)p_Var15[1]._M_nxt == curr)) goto LAB_0093e5d7;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_0093e5d7:
  if (p_Var13 == (__node_base_ptr)0x0) {
    p_Var15 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var15 = p_Var13->_M_nxt;
  }
  if (p_Var15 != (_Hash_node_base *)0x0) {
    local_38 = curr;
    RequestInfo::validate((RequestInfo *)(p_Var15 + 2));
    if (*(int *)&p_Var15[2]._M_nxt == 0) {
      if (p_Var15[3]._M_nxt != (_Hash_node_base *)0x0) {
        __k = p_Var15 + 3;
        p_Var14 = (_Hash_node_base *)0x0;
        p_Var7 = std::
                 _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::_M_find_before_node
                           ((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)&this->requestInfos,
                            (ulong)p_Var15[3]._M_nxt %
                            (this->requestInfos).
                            super_unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                            ._M_h._M_bucket_count,(key_type *)__k,in_RCX);
        if (p_Var7 != (__node_base_ptr)0x0) {
          p_Var14 = p_Var7->_M_nxt;
        }
        if (p_Var14 == (_Hash_node_base *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        if (*(int *)&p_Var14[2]._M_nxt != 0) {
          sVar8 = std::
                  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(&(this->originalLocalMap)._M_h,(key_type *)__k);
          if (sVar8 == 0) {
            __assert_fail("originalLocalMap.count(info.original)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LocalCSE.cpp"
                          ,0x23d,
                          "void wasm::(anonymous namespace)::Applier::visitExpression(Expression *)"
                         );
          }
          pMVar2 = (this->
                   super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   ).
                   super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                   .currModule;
          pmVar6 = std::__detail::
                   _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->originalLocalMap,(key_type *)__k);
          mVar1 = *pmVar6;
          uVar3 = (local_38->type).id;
          pEVar9 = (Expression *)MixedArena::allocSpace(&pMVar2->allocator,0x18,8);
          pEVar9->_id = LocalGetId;
          *(mapped_type *)(pEVar9 + 1) = mVar1;
          (pEVar9->type).id = uVar3;
          Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
          ::replaceCurrent((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                            *)this,pEVar9);
          *(int *)&p_Var14[2]._M_nxt = *(int *)&p_Var14[2]._M_nxt + -1;
        }
      }
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (local_38->type).id;
      IVar5 = Builder::addVar((Builder *)
                              (this->
                              super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                              ).
                              super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                              .currFunction,(Function *)0x0,(Name)(auVar4 << 0x40),TVar11);
      pmVar6 = std::__detail::
               _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->originalLocalMap,&local_38);
      pEVar9 = local_38;
      *pmVar6 = IVar5;
      TVar11.id = (local_38->type).id;
      this_00 = (LocalSet *)
                MixedArena::allocSpace
                          (&((this->
                             super_LinearExecutionWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             ).
                             super_PostWalker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                            .currModule)->allocator,0x20,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId
      ;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
      this_00->index = IVar5;
      this_00->value = pEVar9;
      LocalSet::makeTee(this_00,TVar11);
      Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
      ::replaceCurrent((Walker<wasm::(anonymous_namespace)::Applier,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Applier,_void>_>
                        *)this,(Expression *)this_00);
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    auto iter = requestInfos.find(curr);
    if (iter == requestInfos.end()) {
      return;
    }

    const auto& info = iter->second;
    info.validate();

    if (info.requests) {
      // We have requests for this value. Add a local and tee the value to
      // there.
      Index local = originalLocalMap[curr] =
        Builder::addVar(getFunction(), curr->type);
      replaceCurrent(
        Builder(*getModule()).makeLocalTee(local, curr, curr->type));
    } else if (info.original) {
      auto& originalInfo = requestInfos.at(info.original);
      if (originalInfo.requests) {
        // This is a valid request of an original value. Get the value from the
        // local.
        assert(originalLocalMap.count(info.original));
        replaceCurrent(
          Builder(*getModule())
            .makeLocalGet(originalLocalMap[info.original], curr->type));
        originalInfo.requests--;
      }
    }
  }